

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void I422ToYUY2Row_SSE2(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_yuy2,int width)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  long lVar20;
  int iVar21;
  int width_local;
  
  lVar20 = (long)src_v - (long)src_u;
  do {
    uVar1 = *(undefined8 *)src_u;
    uVar2 = *(undefined8 *)(src_u + lVar20);
    src_u = src_u + 8;
    uVar4 = *src_y;
    uVar5 = src_y[1];
    uVar6 = src_y[2];
    uVar7 = src_y[3];
    uVar8 = src_y[4];
    uVar9 = src_y[5];
    uVar10 = src_y[6];
    uVar11 = src_y[7];
    uVar12 = src_y[8];
    uVar13 = src_y[9];
    uVar14 = src_y[10];
    uVar15 = src_y[0xb];
    uVar16 = src_y[0xc];
    uVar17 = src_y[0xd];
    uVar18 = src_y[0xe];
    uVar19 = src_y[0xf];
    src_y = src_y + 0x10;
    *dst_yuy2 = uVar4;
    dst_yuy2[1] = (uint8_t)uVar1;
    dst_yuy2[2] = uVar5;
    dst_yuy2[3] = (uint8_t)uVar2;
    dst_yuy2[4] = uVar6;
    dst_yuy2[5] = (uint8_t)((ulong)uVar1 >> 8);
    dst_yuy2[6] = uVar7;
    dst_yuy2[7] = (uint8_t)((ulong)uVar2 >> 8);
    dst_yuy2[8] = uVar8;
    dst_yuy2[9] = (uint8_t)((ulong)uVar1 >> 0x10);
    dst_yuy2[10] = uVar9;
    dst_yuy2[0xb] = (uint8_t)((ulong)uVar2 >> 0x10);
    dst_yuy2[0xc] = uVar10;
    dst_yuy2[0xd] = (uint8_t)((ulong)uVar1 >> 0x18);
    dst_yuy2[0xe] = uVar11;
    dst_yuy2[0xf] = (uint8_t)((ulong)uVar2 >> 0x18);
    dst_yuy2[0x10] = uVar12;
    dst_yuy2[0x11] = (uint8_t)((ulong)uVar1 >> 0x20);
    dst_yuy2[0x12] = uVar13;
    dst_yuy2[0x13] = (uint8_t)((ulong)uVar2 >> 0x20);
    dst_yuy2[0x14] = uVar14;
    dst_yuy2[0x15] = (uint8_t)((ulong)uVar1 >> 0x28);
    dst_yuy2[0x16] = uVar15;
    dst_yuy2[0x17] = (uint8_t)((ulong)uVar2 >> 0x28);
    dst_yuy2[0x18] = uVar16;
    dst_yuy2[0x19] = (uint8_t)((ulong)uVar1 >> 0x30);
    dst_yuy2[0x1a] = uVar17;
    dst_yuy2[0x1b] = (uint8_t)((ulong)uVar2 >> 0x30);
    dst_yuy2[0x1c] = uVar18;
    dst_yuy2[0x1d] = (uint8_t)((ulong)uVar1 >> 0x38);
    dst_yuy2[0x1e] = uVar19;
    dst_yuy2[0x1f] = (uint8_t)((ulong)uVar2 >> 0x38);
    dst_yuy2 = dst_yuy2 + 0x20;
    iVar21 = width + -0x10;
    bVar3 = 0xf < width;
    width = iVar21;
  } while (iVar21 != 0 && bVar3);
  return;
}

Assistant:

void I422ToYUY2Row_SSE2(const uint8_t* src_y,
                        const uint8_t* src_u,
                        const uint8_t* src_v,
                        uint8_t* dst_yuy2,
                        int width) {
  asm volatile(

      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "movq        (%1),%%xmm2                   \n"
      "movq        0x00(%1,%2,1),%%xmm1          \n"
      "add         $0x8,%1                       \n"
      "punpcklbw   %%xmm1,%%xmm2                 \n"
      "movdqu      (%0),%%xmm0                   \n"
      "add         $0x10,%0                      \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "punpcklbw   %%xmm2,%%xmm0                 \n"
      "punpckhbw   %%xmm2,%%xmm1                 \n"
      "movdqu      %%xmm0,(%3)                   \n"
      "movdqu      %%xmm1,0x10(%3)               \n"
      "lea         0x20(%3),%3                   \n"
      "sub         $0x10,%4                      \n"
      "jg          1b                            \n"
      : "+r"(src_y),     // %0
        "+r"(src_u),     // %1
        "+r"(src_v),     // %2
        "+r"(dst_yuy2),  // %3
        "+rm"(width)     // %4
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2");
}